

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestValueTestnonIntegers::runTestCase(TestValueTestnonIntegers *this)

{
  TestResult *pTVar1;
  double dVar2;
  bool bVar3;
  ValueType VVar4;
  Int IVar5;
  UInt UVar6;
  LargestInt LVar7;
  LargestUInt LVar8;
  float fVar9;
  allocator local_2d9;
  Value val;
  undefined1 local_2b0 [24];
  char *local_298;
  PredicateContext *local_290;
  Failure *pFStack_288;
  string local_280;
  string local_260;
  IsCheck local_240;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  Value local_190;
  Value local_168;
  Value local_140;
  Value local_118;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  Value local_78;
  Value local_50;
  
  Json::Value::Value(&val,nullValue);
  Json::Value::Value(&local_50,1.5);
  Json::Value::operator=(&val,&local_50);
  Json::Value::~Value(&local_50);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  VVar4 = Json::Value::type(&val);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,realValue,VVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x47d,"Json::realValue == val.type()");
  local_240.isObject_ = false;
  local_240.isArray_ = false;
  local_240.isBool_ = false;
  local_240.isString_ = false;
  local_240.isNull_ = false;
  local_240.isInt_ = false;
  local_240.isInt64_ = false;
  local_240.isUInt_ = false;
  local_240.isUInt64_ = false;
  local_240.isIntegral_ = false;
  local_240.isDouble_ = true;
  local_240.isNumeric_ = true;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_2b0._0_4_ = pTVar1->predicateId_;
  local_2b0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0._16_4_ = 0x482;
  local_298 = "checkIs(val, checks)";
  local_290 = (PredicateContext *)0x0;
  pFStack_288 = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)local_2b0;
  pTVar1->predicateId_ = local_2b0._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)local_2b0;
  ValueTest::checkIs(&this->super_ValueTest,&val,&local_240);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar3 = Json::Value::isConvertibleTo(&val,intValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x484,"val.isConvertibleTo(Json::intValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,uintValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x485,"val.isConvertibleTo(Json::uintValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,realValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x486,"val.isConvertibleTo(Json::realValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,booleanValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x487,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,stringValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x488,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,nullValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x489,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,arrayValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x48a,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,objectValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x48b,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(&val);
  JsonTest::checkEqual<double,double>
            (pTVar1,1.5,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x48d,"1.5 == val.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar9 = Json::Value::asFloat(&val);
  JsonTest::checkEqual<double,float>
            (pTVar1,1.5,fVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x48e,"1.5 == val.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  IVar5 = Json::Value::asInt(&val);
  JsonTest::checkEqual<int,int>
            (pTVar1,1,IVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x48f,"1 == val.asInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar7 = Json::Value::asLargestInt(&val);
  JsonTest::checkEqual<int,long_long>
            (pTVar1,1,LVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x490,"1 == val.asLargestInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  UVar6 = Json::Value::asUInt(&val);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar1,1,UVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x491,"1 == val.asUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar8 = Json::Value::asLargestUInt(&val);
  JsonTest::checkEqual<int,unsigned_long_long>
            (pTVar1,1,LVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x492,"1 == val.asLargestUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar3 = Json::Value::asBool(&val);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x493,"true == val.asBool()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_(&local_1b0,&val);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar1,"1.5",&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x494,"\"1.5\" == val.asString()");
  std::__cxx11::string::~string((string *)&local_1b0);
  Json::Value::Value(&local_78,-1.5);
  Json::Value::operator=(&val,&local_78);
  Json::Value::~Value(&local_78);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  VVar4 = Json::Value::type(&val);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,realValue,VVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x499,"Json::realValue == val.type()");
  local_240.isObject_ = false;
  local_240.isArray_ = false;
  local_240.isBool_ = false;
  local_240.isString_ = false;
  local_240.isNull_ = false;
  local_240.isInt_ = false;
  local_240.isInt64_ = false;
  local_240.isUInt_ = false;
  local_240.isUInt64_ = false;
  local_240.isIntegral_ = false;
  local_240.isDouble_ = true;
  local_240.isNumeric_ = true;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_2b0._0_4_ = pTVar1->predicateId_;
  local_2b0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0._16_4_ = 0x49e;
  local_298 = "checkIs(val, checks)";
  local_290 = (PredicateContext *)0x0;
  pFStack_288 = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)local_2b0;
  pTVar1->predicateId_ = local_2b0._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)local_2b0;
  ValueTest::checkIs(&this->super_ValueTest,&val,&local_240);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar3 = Json::Value::isConvertibleTo(&val,intValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a0,"val.isConvertibleTo(Json::intValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,realValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a1,"val.isConvertibleTo(Json::realValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,booleanValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a2,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,stringValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a3,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,nullValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a4,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,uintValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a5,"!val.isConvertibleTo(Json::uintValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,arrayValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a6,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,objectValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4a7,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(&val);
  JsonTest::checkEqual<double,double>
            (pTVar1,-1.5,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4a9,"-1.5 == val.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar9 = Json::Value::asFloat(&val);
  JsonTest::checkEqual<double,float>
            (pTVar1,-1.5,fVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4aa,"-1.5 == val.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  IVar5 = Json::Value::asInt(&val);
  JsonTest::checkEqual<int,int>
            (pTVar1,-1,IVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ab,"-1 == val.asInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar7 = Json::Value::asLargestInt(&val);
  JsonTest::checkEqual<int,long_long>
            (pTVar1,-1,LVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ac,"-1 == val.asLargestInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar3 = Json::Value::asBool(&val);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ad,"true == val.asBool()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_(&local_1d0,&val);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar1,"-1.5",&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ae,"\"-1.5\" == val.asString()");
  std::__cxx11::string::~string((string *)&local_1d0);
  Json::Value::Value(&local_a0,2147483647.5);
  Json::Value::operator=(&val,&local_a0);
  Json::Value::~Value(&local_a0);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  VVar4 = Json::Value::type(&val);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,realValue,VVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4b3,"Json::realValue == val.type()");
  local_240.isObject_ = false;
  local_240.isArray_ = false;
  local_240.isBool_ = false;
  local_240.isString_ = false;
  local_240.isNull_ = false;
  local_240.isInt_ = false;
  local_240.isInt64_ = false;
  local_240.isUInt_ = false;
  local_240.isUInt64_ = false;
  local_240.isIntegral_ = false;
  local_240.isDouble_ = true;
  local_240.isNumeric_ = true;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_2b0._0_4_ = pTVar1->predicateId_;
  local_2b0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0._16_4_ = 0x4b8;
  local_298 = "checkIs(val, checks)";
  local_290 = (PredicateContext *)0x0;
  pFStack_288 = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)local_2b0;
  pTVar1->predicateId_ = local_2b0._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)local_2b0;
  ValueTest::checkIs(&this->super_ValueTest,&val,&local_240);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar3 = Json::Value::isConvertibleTo(&val,uintValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4ba,"val.isConvertibleTo(Json::uintValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,realValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bb,"val.isConvertibleTo(Json::realValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,booleanValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bc,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,stringValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bd,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,nullValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4be,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,intValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4bf,"!val.isConvertibleTo(Json::intValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,arrayValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4c0,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,objectValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4c1,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(&val);
  JsonTest::checkEqual<double,double>
            (pTVar1,2147483647.5,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c3,"2147483647.5 == val.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar9 = Json::Value::asFloat(&val);
  JsonTest::checkEqual<float,float>
            (pTVar1,2.1474836e+09,fVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c4,"float(2147483647.5) == val.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  UVar6 = Json::Value::asUInt(&val);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,0x7fffffff,UVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c5,"2147483647U == val.asUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar7 = Json::Value::asLargestInt(&val);
  JsonTest::checkEqual<long,long_long>
            (pTVar1,0x7fffffff,LVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c7,"2147483647L == val.asLargestInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar8 = Json::Value::asLargestUInt(&val);
  JsonTest::checkEqual<unsigned_int,unsigned_long_long>
            (pTVar1,0x7fffffff,LVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4c8,"2147483647U == val.asLargestUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar3 = Json::Value::asBool(&val);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ca,"true == val.asBool()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_((string *)local_2b0,&val);
  ValueTest::normalizeFloatingPointStr(&local_1f0,(string *)local_2b0);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar1,"2147483647.5",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4cc,"\"2147483647.5\" == normalizeFloatingPointStr(val.asString())");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)local_2b0);
  Json::Value::Value(&local_c8,-2147483648.5);
  Json::Value::operator=(&val,&local_c8);
  Json::Value::~Value(&local_c8);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  VVar4 = Json::Value::type(&val);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,realValue,VVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4d1,"Json::realValue == val.type()");
  local_240.isObject_ = false;
  local_240.isArray_ = false;
  local_240.isBool_ = false;
  local_240.isString_ = false;
  local_240.isNull_ = false;
  local_240.isInt_ = false;
  local_240.isInt64_ = false;
  local_240.isUInt_ = false;
  local_240.isUInt64_ = false;
  local_240.isIntegral_ = false;
  local_240.isDouble_ = true;
  local_240.isNumeric_ = true;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_2b0._0_4_ = pTVar1->predicateId_;
  local_2b0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0._16_4_ = 0x4d6;
  local_298 = "checkIs(val, checks)";
  local_290 = (PredicateContext *)0x0;
  pFStack_288 = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)local_2b0;
  pTVar1->predicateId_ = local_2b0._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)local_2b0;
  ValueTest::checkIs(&this->super_ValueTest,&val,&local_240);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar3 = Json::Value::isConvertibleTo(&val,realValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4d8,"val.isConvertibleTo(Json::realValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,booleanValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4d9,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,stringValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4da,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,nullValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4db,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,intValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4dc,"!val.isConvertibleTo(Json::intValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,uintValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4dd,"!val.isConvertibleTo(Json::uintValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,arrayValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4de,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,objectValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4df,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(&val);
  JsonTest::checkEqual<double,double>
            (pTVar1,-2147483648.5,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e1,"-2147483648.5 == val.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar9 = Json::Value::asFloat(&val);
  JsonTest::checkEqual<float,float>
            (pTVar1,-2.1474836e+09,fVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e2,"float(-2147483648.5) == val.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar7 = Json::Value::asLargestInt(&val);
  JsonTest::checkEqual<long_long,long_long>
            (pTVar1,-0x80000000,LVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e4,"-Json::Int64(1) << 31 == val.asLargestInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar3 = Json::Value::asBool(&val);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e6,"true == val.asBool()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_((string *)local_2b0,&val);
  ValueTest::normalizeFloatingPointStr(&local_210,(string *)local_2b0);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar1,"-2147483648.5",&local_210,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4e8,"\"-2147483648.5\" == normalizeFloatingPointStr(val.asString())");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_2b0);
  Json::Value::Value(&local_f0,4294967295.5);
  Json::Value::operator=(&val,&local_f0);
  Json::Value::~Value(&local_f0);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  VVar4 = Json::Value::type(&val);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,realValue,VVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4ed,"Json::realValue == val.type()");
  local_240.isObject_ = false;
  local_240.isArray_ = false;
  local_240.isBool_ = false;
  local_240.isString_ = false;
  local_240.isNull_ = false;
  local_240.isInt_ = false;
  local_240.isInt64_ = false;
  local_240.isUInt_ = false;
  local_240.isUInt64_ = false;
  local_240.isIntegral_ = false;
  local_240.isDouble_ = true;
  local_240.isNumeric_ = true;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_2b0._0_4_ = pTVar1->predicateId_;
  local_2b0._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_2b0._16_4_ = 0x4f2;
  local_298 = "checkIs(val, checks)";
  local_290 = (PredicateContext *)0x0;
  pFStack_288 = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)local_2b0;
  pTVar1->predicateId_ = local_2b0._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)local_2b0;
  ValueTest::checkIs(&this->super_ValueTest,&val,&local_240);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  bVar3 = Json::Value::isConvertibleTo(&val,realValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f4,"val.isConvertibleTo(Json::realValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,booleanValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f5,"val.isConvertibleTo(Json::booleanValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,stringValue);
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f6,"val.isConvertibleTo(Json::stringValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,nullValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f7,"!val.isConvertibleTo(Json::nullValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,intValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f8,"!val.isConvertibleTo(Json::intValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,uintValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4f9,"!val.isConvertibleTo(Json::uintValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,arrayValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4fa,"!val.isConvertibleTo(Json::arrayValue)");
  }
  bVar3 = Json::Value::isConvertibleTo(&val,objectValue);
  if (bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x4fb,"!val.isConvertibleTo(Json::objectValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(&val);
  JsonTest::checkEqual<double,double>
            (pTVar1,4294967295.5,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4fd,"4294967295.5 == val.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar9 = Json::Value::asFloat(&val);
  JsonTest::checkEqual<float,float>
            (pTVar1,4.2949673e+09,fVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x4fe,"float(4294967295.5) == val.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar7 = Json::Value::asLargestInt(&val);
  JsonTest::checkEqual<long_long,long_long>
            (pTVar1,0xffffffff,LVar7,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x500,"(Json::Int64(1) << 32) - 1 == val.asLargestInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  LVar8 = Json::Value::asLargestUInt(&val);
  JsonTest::checkEqual<unsigned_long_long,unsigned_long_long>
            (pTVar1,0xffffffff,LVar8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x502,"(Json::UInt64(1) << 32) - Json::UInt64(1) == val.asLargestUInt()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  bVar3 = Json::Value::asBool(&val);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x504,"true == val.asBool()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::asString_abi_cxx11_((string *)local_2b0,&val);
  ValueTest::normalizeFloatingPointStr(&local_230,(string *)local_2b0);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            (pTVar1,"4294967295.5",&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x506,"\"4294967295.5\" == normalizeFloatingPointStr(val.asString())");
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)local_2b0);
  Json::Value::Value(&local_118,1.2345678901234);
  Json::Value::operator=(&val,&local_118);
  Json::Value::~Value(&local_118);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)local_2b0,"1.2345678901234001",&local_2d9);
  Json::Value::asString_abi_cxx11_(&local_280,&val);
  ValueTest::normalizeFloatingPointStr(&local_260,&local_280);
  JsonTest::checkStringEqual
            (pTVar1,(string *)local_2b0,&local_260,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x50a,"\"1.2345678901234001\" == normalizeFloatingPointStr(val.asString())");
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)local_2b0);
  Json::Value::Value(&local_140,2.199023255552e+15);
  Json::Value::operator=(&val,&local_140);
  Json::Value::~Value(&local_140);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar9 = Json::Value::asFloat(&val);
  JsonTest::checkEqual<float,float>
            (pTVar1,2.1990233e+15,fVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x50e,"float(2199023255552000) == val.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)local_2b0,"2199023255552000",&local_2d9);
  Json::Value::asString_abi_cxx11_(&local_280,&val);
  ValueTest::normalizeFloatingPointStr(&local_260,&local_280);
  JsonTest::checkStringEqual
            (pTVar1,(string *)local_2b0,&local_260,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x510,"\"2199023255552000\" == normalizeFloatingPointStr(val.asString())");
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)local_2b0);
  Json::Value::Value(&local_168,3.402823466385289e+38);
  Json::Value::operator=(&val,&local_168);
  Json::Value::~Value(&local_168);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  fVar9 = Json::Value::asFloat(&val);
  JsonTest::checkEqual<float,float>
            (pTVar1,3.4028235e+38,fVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x514,"float(3.402823466385289e38) == val.asFloat()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)local_2b0,"3.402823466385289e+38",&local_2d9);
  Json::Value::asString_abi_cxx11_(&local_280,&val);
  ValueTest::normalizeFloatingPointStr(&local_260,&local_280);
  JsonTest::checkStringEqual
            (pTVar1,(string *)local_2b0,&local_260,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x516,"\"3.402823466385289e+38\" == normalizeFloatingPointStr(val.asString())");
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)local_2b0);
  Json::Value::Value(&local_190,1.2345678e+300);
  Json::Value::operator=(&val,&local_190);
  Json::Value::~Value(&local_190);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  dVar2 = Json::Value::asDouble(&val);
  JsonTest::checkEqual<double,double>
            (pTVar1,1.2345678e+300,dVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x51a,"double(1.2345678e300) == val.asDouble()");
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)local_2b0,"1.2345678e+300",&local_2d9);
  Json::Value::asString_abi_cxx11_(&local_280,&val);
  ValueTest::normalizeFloatingPointStr(&local_260,&local_280);
  JsonTest::checkStringEqual
            (pTVar1,(string *)local_2b0,&local_260,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x51c,"\"1.2345678e+300\" == normalizeFloatingPointStr(val.asString())");
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)local_2b0);
  Json::Value::~Value(&val);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, nonIntegers) {
  IsCheck checks;
  Json::Value val;

  // Small positive number
  val = Json::Value(1.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(1.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(1.5, val.asFloat());
  JSONTEST_ASSERT_EQUAL(1, val.asInt());
  JSONTEST_ASSERT_EQUAL(1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(1, val.asUInt());
  JSONTEST_ASSERT_EQUAL(1, val.asLargestUInt());
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("1.5", val.asString());

  // Small negative number
  val = Json::Value(-1.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(-1.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(-1.5, val.asFloat());
  JSONTEST_ASSERT_EQUAL(-1, val.asInt());
  JSONTEST_ASSERT_EQUAL(-1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("-1.5", val.asString());

  // A bit over int32 max
  val = Json::Value(kint32max + 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(2147483647.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(2147483647.5), val.asFloat());
  JSONTEST_ASSERT_EQUAL(2147483647U, val.asUInt());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(2147483647L, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(2147483647U, val.asLargestUInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("2147483647.5",
                        normalizeFloatingPointStr(val.asString()));

  // A bit under int32 min
  val = Json::Value(kint32min - 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(-2147483648.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(-2147483648.5), val.asFloat());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(-Json::Int64(1) << 31, val.asLargestInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("-2147483648.5",
                        normalizeFloatingPointStr(val.asString()));

  // A bit over uint32 max
  val = Json::Value(kuint32max + 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(4294967295.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(4294967295.5), val.asFloat());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL((Json::Int64(1) << 32) - 1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL((Json::UInt64(1) << 32) - Json::UInt64(1),
                        val.asLargestUInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("4294967295.5",
                        normalizeFloatingPointStr(val.asString()));

  val = Json::Value(1.2345678901234);
  JSONTEST_ASSERT_STRING_EQUAL("1.2345678901234001",
                               normalizeFloatingPointStr(val.asString()));

  // A 16-digit floating point number.
  val = Json::Value(2199023255552000.0f);
  JSONTEST_ASSERT_EQUAL(float(2199023255552000), val.asFloat());
  JSONTEST_ASSERT_STRING_EQUAL("2199023255552000",
                               normalizeFloatingPointStr(val.asString()));

  // A very large floating point number.
  val = Json::Value(3.402823466385289e38);
  JSONTEST_ASSERT_EQUAL(float(3.402823466385289e38), val.asFloat());
  JSONTEST_ASSERT_STRING_EQUAL("3.402823466385289e+38",
                               normalizeFloatingPointStr(val.asString()));

  // An even larger floating point number.
  val = Json::Value(1.2345678e300);
  JSONTEST_ASSERT_EQUAL(double(1.2345678e300), val.asDouble());
  JSONTEST_ASSERT_STRING_EQUAL("1.2345678e+300",
                               normalizeFloatingPointStr(val.asString()));
}